

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O1

void __thiscall FileSystemForJUnitTestOutputTests::clear(FileSystemForJUnitTestOutputTests *this)

{
  FileForJUnitOutputTests *this_00;
  FileForJUnitOutputTests *fileToBeDeleted;
  
  this_00 = this->firstFile_;
  while (this_00 != (FileForJUnitOutputTests *)0x0) {
    this->firstFile_ = this_00->next_;
    SimpleStringCollection::~SimpleStringCollection(&this_00->linesOfFile_);
    SimpleString::~SimpleString(&this_00->buffer_);
    SimpleString::~SimpleString(&this_00->name_);
    operator_delete(this_00,0x50);
    this_00 = this->firstFile_;
  }
  return;
}

Assistant:

void clear(void)
    {
        while (firstFile_) {
            FileForJUnitOutputTests* fileToBeDeleted = firstFile_;
            firstFile_ = firstFile_->nextFile();
            delete fileToBeDeleted;
        }
    }